

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomFiveAction.cpp
# Opt level: O0

ActionResults * __thiscall WhiteRoomFiveAction::Pick(WhiteRoomFiveAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ActionResults *pAVar3;
  ItemWrapper *pIVar4;
  bool bVar5;
  allocator local_79;
  string local_78 [32];
  itemType local_58 [2];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  WhiteRoomFiveAction *local_18;
  WhiteRoomFiveAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BOWL) {
    pAVar3 = (ActionResults *)operator_new(0x30);
    local_4d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"You can\'t pick it up. It\'s stuck to the table!",&local_39);
    ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_38);
    local_4d = 0;
    this_local = (WhiteRoomFiveAction *)pAVar3;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    bVar5 = false;
    if (iVar1 == PITCHER) {
      local_58[1] = 0x2e;
      pIVar4 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_58 + 1);
      iVar2 = ItemWrapper::getLocation(pIVar4);
      bVar5 = iVar2 != BACKPACK;
    }
    if (bVar5) {
      local_58[0] = PITCHER;
      pIVar4 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_58);
      ItemWrapper::setLocation(pIVar4,BACKPACK);
      pAVar3 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,
                 "Cool... you can use this at your next party. It seems to be carrying some unknown, dark liquid."
                 ,&local_79);
      ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_78);
      this_local = (WhiteRoomFiveAction *)pAVar3;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      this_local = (WhiteRoomFiveAction *)AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *WhiteRoomFiveAction::Pick() {
    if(commands->getMainItem() == BOWL) {
        return new ActionResults(CURRENT, "You can't pick it up. It's stuck to the table!");
    }
    else if(commands->getMainItem() == PITCHER && itemList->getValue(PITCHER)->getLocation() != BACKPACK){
        itemList->getValue(PITCHER)->setLocation(BACKPACK);
        return new ActionResults(CURRENT, "Cool... you can use this at your next party. It seems to be carrying some unknown, dark liquid.");
    }
    else {
        return AbstractRoomAction::Pick();
    }
}